

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O3

void gai_oper_elem(Integer g_a,Integer *lo,Integer *hi,void *scalar,Integer op)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 uVar3;
  int iVar4;
  double dVar5;
  Integer IVar6;
  int iVar7;
  logical lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  long lVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  bool bVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  char *data_ptr;
  Integer type;
  Integer ndim;
  Integer loA [7];
  Integer hiA [7];
  Integer ld [7];
  Integer loS [7];
  Integer bunit [7];
  Integer dims [7];
  _iterator_hdl hdl;
  char *local_588;
  char *local_580;
  undefined4 local_574;
  long local_570;
  long local_568;
  int local_55c;
  Integer *local_558;
  Integer *local_550;
  long local_548;
  Integer local_540;
  long local_538;
  Integer local_530;
  Integer local_528;
  long local_520 [6];
  long lStack_4f0;
  int local_4e8 [2];
  long local_4e0 [7];
  long local_4a8 [7];
  long alStack_470 [9];
  long local_428 [8];
  long local_3e8 [8];
  undefined8 local_3a8;
  long lStack_3a0;
  undefined1 local_398 [48];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_558 = lo;
  local_550 = hi;
  local_540 = op;
  pnga_nodeid();
  bVar20 = _ga_sync_begin != 0;
  local_55c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar20) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"gai_oper_elem");
  pnga_inquire(g_a,&local_570,&local_568,local_368);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&local_330);
  iVar7 = pnga_local_iterator_next(&local_330,&local_528,(Integer *)local_4e8,&local_588,local_4a8);
  do {
    if (iVar7 == 0) {
      if (local_55c != 0) {
        pnga_sync();
      }
      return;
    }
    pnga_nnodes();
    lVar9 = local_568;
    if (0 < local_568) {
      memcpy(alStack_470 + 1,&local_528,local_568 * 8);
    }
    lVar8 = pnga_patch_intersect(local_558,local_550,&local_528,(Integer *)local_4e8,lVar9);
    if (lVar8 != 0) {
      if (0 < local_568) {
        lVar9 = 0;
LAB_001273f7:
        if (local_520[lVar9 + -1] <= alStack_470[lVar9 + 1]) break;
        if (local_568 == 1) {
          lVar9 = 1;
          lVar10 = 0;
        }
        else {
          lVar9 = 1;
          lVar10 = 0;
          lVar18 = 0;
          do {
            lVar10 = lVar10 + (local_520[lVar18 + -1] - alStack_470[lVar18 + 1]) * lVar9;
            lVar9 = lVar9 * local_4a8[lVar18];
            lVar18 = lVar18 + 1;
          } while (local_568 + -1 != lVar18);
        }
        if (local_570 - 0x3e9U < 7) {
          lVar10 = ((&local_530)[local_568] - alStack_470[local_568]) * lVar9 + lVar10;
          switch(local_570) {
          case 0x3e9:
          case 0x3eb:
            lVar10 = lVar10 * 4;
            break;
          default:
            lVar10 = lVar10 * 8;
            break;
          case 0x3ed:
            goto switchD_001274bd_caseD_3ed;
          case 0x3ef:
            lVar10 = lVar10 * 0x10;
          }
          local_588 = local_588 + lVar10;
        }
        else {
switchD_001274bd_caseD_3ed:
          pnga_error(" wrong data type ",local_570);
        }
LAB_001274d4:
        local_580 = local_588;
        local_574 = (undefined4)CONCAT71((int7)((ulong)local_588 >> 8),1 < local_568);
        if (local_568 < 2) {
          local_574 = 0;
          lVar9 = 1;
        }
        else {
          lVar9 = 1;
          lVar10 = 1;
          do {
            lVar9 = lVar9 * ((local_4e0[lVar10 + -1] - local_520[lVar10 + -1]) + 1);
            lVar10 = lVar10 + 1;
          } while (local_568 != lVar10);
        }
        goto LAB_00127527;
      }
      local_580 = local_588;
      lVar9 = 1;
      local_574 = 0;
LAB_00127527:
      lVar18 = local_568;
      lVar10 = local_570;
      local_3a8 = 0;
      lStack_3a0 = 0;
      local_3e8[0] = 1;
      local_3e8[1] = 1;
      local_428[0] = local_4a8[0];
      lVar17 = local_4a8[0] * local_4a8[1];
      local_428[1] = lVar17;
      local_588 = local_580;
      if (2 < local_568) {
        memset(local_398,0,local_568 * 8 - 0x10);
        lVar11 = 2;
        lVar14 = 1;
        do {
          lVar14 = lVar14 * (((&lStack_4f0)[lVar11] - (&local_530)[lVar11]) + 1);
          lVar17 = lVar17 * local_4a8[lVar11];
          local_3e8[lVar11] = lVar14;
          local_428[lVar11] = lVar17;
          lVar11 = lVar11 + 1;
        } while (lVar18 != lVar11);
      }
      if (0 < lVar9) {
        local_548 = (long)(int)lVar10;
        pauVar19 = (undefined1 (*) [16])0x0;
        lVar17 = 0;
        local_530 = lVar10;
        local_538 = lVar9;
        do {
          IVar6 = local_530;
          if ((char)local_574 == '\0') {
            lVar9 = 0;
          }
          else {
            lVar10 = 0;
            lVar9 = 0;
            do {
              lVar9 = lVar9 + local_428[lVar10] * *(long *)(local_398 + lVar10 * 8 + -8);
              lVar14 = *(long *)(local_398 + lVar10 * 8 + -8) +
                       (ulong)((lVar17 + 1) % local_3e8[lVar10 + 1] == 0);
              lVar11 = 0;
              if (lVar14 <= local_4e0[lVar10] - local_520[lVar10]) {
                lVar11 = lVar14;
              }
              *(long *)(local_398 + lVar10 * 8 + -8) = lVar11;
              lVar10 = lVar10 + 1;
            } while (lVar18 + -1 != lVar10);
          }
          switch(local_530) {
          case 0x3e9:
          case 0x3eb:
            pauVar19 = (undefined1 (*) [16])(local_580 + lVar9 * 4);
            break;
          case 0x3ea:
          case 0x3ec:
          case 0x3ee:
            pauVar19 = (undefined1 (*) [16])(local_580 + lVar9 * 8);
            break;
          default:
            pnga_error("wrong data type.",local_530);
            break;
          case 0x3ef:
            pauVar19 = (undefined1 (*) [16])(local_580 + lVar9 * 0x10);
          }
          uVar13 = local_4e8[0] - (int)local_528;
          uVar21 = uVar13 + 1;
          uVar12 = (ulong)uVar21;
          uVar3 = (undefined4)IVar6;
          if (local_540 == 2) {
            switch(uVar3) {
            case 0x3e9:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  iVar7 = *(int *)(*pauVar19 + uVar16 * 4);
                  if (iVar7 == 0) {
                    pnga_error("zero value at index",uVar16);
                  }
                  else {
                    if (2 < iVar7 + 1U) {
                      iVar7 = 0;
                    }
                    *(int *)(*pauVar19 + uVar16 * 4) = iVar7;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3ea:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  lVar9 = *(long *)(*pauVar19 + uVar16 * 8);
                  if (lVar9 == 0) {
                    pnga_error("zero value at index",uVar16);
                  }
                  else {
                    if (2 < lVar9 + 1U) {
                      lVar9 = 0;
                    }
                    *(long *)(*pauVar19 + uVar16 * 8) = lVar9;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3eb:
              if (uVar13 < 0x7fffffff) {
                uVar12 = 0;
                do {
                  fVar25 = *(float *)(*pauVar19 + uVar12 * 4);
                  if ((fVar25 != 0.0) || (NAN(fVar25))) {
                    *(float *)(*pauVar19 + uVar12 * 4) = 1.0 / fVar25;
                  }
                  else {
                    pnga_error("zero value at index",uVar12);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar21 != uVar12);
              }
              break;
            case 0x3ec:
              if (uVar13 < 0x7fffffff) {
                uVar12 = 0;
                do {
                  dVar33 = *(double *)(*pauVar19 + uVar12 * 8);
                  if ((dVar33 != 0.0) || (NAN(dVar33))) {
                    *(double *)(*pauVar19 + uVar12 * 8) = 1.0 / dVar33;
                  }
                  else {
                    pnga_error("zero value at index",uVar12);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar21 != uVar12);
              }
              break;
            default:
              goto switchD_00127707_caseD_3ed;
            case 0x3ee:
              if (uVar13 < 0x7fffffff) {
                uVar12 = 0;
                do {
                  fVar25 = (float)*(undefined8 *)(*pauVar19 + uVar12 * 8);
                  fVar27 = (float)((ulong)*(undefined8 *)(*pauVar19 + uVar12 * 8) >> 0x20);
                  uVar13 = -(uint)(-fVar25 <= fVar25);
                  uVar23 = -(uint)(-fVar27 <= fVar27);
                  uVar16 = CONCAT44(~uVar23 & (uint)-fVar27,~uVar13 & (uint)-fVar25) |
                           CONCAT44((uint)fVar27 & uVar23,(uint)fVar25 & uVar13);
                  if ((float)(uVar16 >> 0x20) <= (float)uVar16) {
                    if ((fVar25 != 0.0) || (NAN(fVar25))) {
                      fVar27 = fVar27 / fVar25;
                      fVar26 = 1.0 / ((fVar27 * fVar27 + 1.0) * fVar25);
                      *(float *)(*pauVar19 + uVar12 * 8) = fVar26;
                      fVar26 = -fVar27 * fVar26;
                      goto LAB_00127cee;
                    }
                    pnga_error("zero value at index",uVar12);
                  }
                  else {
                    fVar25 = fVar25 / fVar27;
                    fVar26 = 1.0 / ((fVar25 * fVar25 + 1.0) * fVar27);
                    *(float *)(*pauVar19 + uVar12 * 8) = fVar25 * fVar26;
                    fVar26 = -fVar26;
LAB_00127cee:
                    *(float *)(*pauVar19 + uVar12 * 8 + 4) = fVar26;
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar21 != uVar12);
              }
              break;
            case 0x3ef:
              if (uVar13 < 0x7fffffff) {
                uVar12 = 0;
                pauVar15 = pauVar19;
                do {
                  dVar33 = *(double *)*pauVar15;
                  dVar29 = *(double *)(*pauVar15 + 8);
                  uVar22 = -(ulong)(-dVar33 <= dVar33);
                  uVar24 = -(ulong)(-dVar29 <= dVar29);
                  uVar16 = (ulong)dVar29 & uVar24;
                  auVar34._0_8_ = ~uVar22 & (ulong)-dVar33;
                  auVar34._8_8_ = ~uVar24 & (ulong)-dVar29;
                  auVar2._8_4_ = (int)uVar16;
                  auVar2._0_8_ = (ulong)dVar33 & uVar22;
                  auVar2._12_4_ = (int)(uVar16 >> 0x20);
                  if (SUB168(auVar34 | auVar2,8) <= SUB168(auVar34 | auVar2,0)) {
                    if ((dVar33 != 0.0) || (NAN(dVar33))) {
                      dVar29 = dVar29 / dVar33;
                      dVar33 = 1.0 / ((dVar29 * dVar29 + 1.0) * dVar33);
                      *(double *)*pauVar15 = dVar33;
                      *(double *)(*pauVar15 + 8) = -dVar29 * dVar33;
                    }
                    else {
                      pnga_error("zero value at index",uVar12);
                    }
                  }
                  else {
                    dVar33 = dVar33 / dVar29;
                    dVar29 = 1.0 / ((dVar33 * dVar33 + 1.0) * dVar29);
                    *(double *)*pauVar15 = dVar33 * dVar29;
                    *(double *)(*pauVar15 + 8) = -dVar29;
                  }
                  uVar12 = uVar12 + 1;
                  pauVar15 = pauVar15 + 1;
                } while (uVar21 != uVar12);
              }
            }
          }
          else if (local_540 == 1) {
            switch(uVar3) {
            case 0x3e9:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  *(int *)(*pauVar19 + uVar16 * 4) = *(int *)(*pauVar19 + uVar16 * 4) + *scalar;
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3ea:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  *(long *)(*pauVar19 + uVar16 * 8) = *(long *)(*pauVar19 + uVar16 * 8) + *scalar;
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3eb:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  *(float *)(*pauVar19 + uVar16 * 4) = *scalar + *(float *)(*pauVar19 + uVar16 * 4);
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3ec:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  *(double *)(*pauVar19 + uVar16 * 8) =
                       *scalar + *(double *)(*pauVar19 + uVar16 * 8);
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            default:
switchD_00127707_caseD_3ed:
              pnga_error("wrong data type",local_548);
              break;
            case 0x3ee:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  *(ulong *)(*pauVar19 + uVar16 * 8) =
                       CONCAT44((float)((ulong)*(undefined8 *)(*pauVar19 + uVar16 * 8) >> 0x20) +
                                (float)((ulong)*scalar >> 0x20),
                                (float)*(undefined8 *)(*pauVar19 + uVar16 * 8) + (float)*scalar);
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3ef:
              pauVar15 = pauVar19;
              if (uVar13 < 0x7fffffff) {
                do {
                  auVar31._0_8_ = *(double *)*pauVar15 + *scalar;
                  auVar31._8_8_ = *(double *)(*pauVar15 + 8) + *(double *)((long)scalar + 8);
                  *pauVar15 = auVar31;
                  uVar12 = uVar12 - 1;
                  pauVar15 = pauVar15 + 1;
                } while (uVar12 != 0);
              }
            }
          }
          else {
            switch(uVar3) {
            case 0x3e9:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  iVar7 = *(int *)(*pauVar19 + uVar16 * 4);
                  iVar4 = -iVar7;
                  if (0 < iVar7) {
                    iVar4 = iVar7;
                  }
                  *(int *)(*pauVar19 + uVar16 * 4) = iVar4;
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3ea:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  lVar9 = *(long *)(*pauVar19 + uVar16 * 8);
                  lVar10 = -lVar9;
                  if (0 < lVar9) {
                    lVar10 = lVar9;
                  }
                  *(long *)(*pauVar19 + uVar16 * 8) = lVar10;
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3eb:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  fVar25 = *(float *)(*pauVar19 + uVar16 * 4);
                  uVar21 = -(uint)(fVar25 < -fVar25);
                  *(uint *)(*pauVar19 + uVar16 * 4) =
                       ~uVar21 & (uint)fVar25 | (uint)-fVar25 & uVar21;
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3ec:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  dVar33 = *(double *)(*pauVar19 + uVar16 * 8);
                  uVar22 = -(ulong)(dVar33 < -dVar33);
                  *(ulong *)(*pauVar19 + uVar16 * 8) =
                       ~uVar22 & (ulong)dVar33 | (ulong)-dVar33 & uVar22;
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            default:
              goto switchD_00127707_caseD_3ed;
            case 0x3ee:
              if (uVar13 < 0x7fffffff) {
                uVar16 = 0;
                do {
                  fVar27 = (float)*(undefined8 *)(*pauVar19 + uVar16 * 8);
                  fVar26 = (float)((ulong)*(undefined8 *)(*pauVar19 + uVar16 * 8) >> 0x20);
                  uVar21 = -(uint)(-fVar27 <= fVar27);
                  uVar13 = -(uint)(-fVar26 <= fVar26);
                  uVar22 = CONCAT44(~uVar13 & (uint)-fVar26,~uVar21 & (uint)-fVar27) |
                           CONCAT44((uint)fVar26 & uVar13,(uint)fVar27 & uVar21);
                  fVar28 = (float)uVar22;
                  fVar25 = (float)(uVar22 >> 0x20);
                  if (fVar25 <= fVar28) {
                    fVar25 = 0.0;
                    if ((fVar27 != 0.0) || (NAN(fVar27))) {
                      fVar25 = SQRT((fVar26 / fVar27) * (fVar26 / fVar27) + 1.0) * fVar28;
                    }
                  }
                  else {
                    fVar25 = SQRT((fVar27 / fVar26) * (fVar27 / fVar26) + 1.0) * fVar25;
                  }
                  *(float *)(*pauVar19 + uVar16 * 8) = fVar25;
                  *(undefined4 *)(*pauVar19 + uVar16 * 8 + 4) = 0;
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              break;
            case 0x3ef:
              if (uVar13 < 0x7fffffff) {
                lVar9 = 0;
                do {
                  dVar29 = *(double *)(*pauVar19 + lVar9);
                  dVar5 = *(double *)((long)(*pauVar19 + lVar9) + 8);
                  uVar22 = -(ulong)(-dVar29 <= dVar29);
                  uVar24 = -(ulong)(-dVar5 <= dVar5);
                  uVar16 = (ulong)dVar5 & uVar24;
                  auVar32._0_8_ = ~uVar22 & (ulong)-dVar29;
                  auVar32._8_8_ = ~uVar24 & (ulong)-dVar5;
                  auVar1._8_4_ = (int)uVar16;
                  auVar1._0_8_ = (ulong)dVar29 & uVar22;
                  auVar1._12_4_ = (int)(uVar16 >> 0x20);
                  dVar30 = SUB168(auVar32 | auVar1,0);
                  dVar33 = SUB168(auVar32 | auVar1,8);
                  if (dVar33 <= dVar30) {
                    dVar33 = 0.0;
                    if ((dVar29 != 0.0) || (NAN(dVar29))) {
                      dVar33 = SQRT((dVar5 / dVar29) * (dVar5 / dVar29) + 1.0) * dVar30;
                    }
                  }
                  else {
                    dVar33 = SQRT((dVar29 / dVar5) * (dVar29 / dVar5) + 1.0) * dVar33;
                  }
                  *(double *)(*pauVar19 + lVar9) = dVar33;
                  *(undefined8 *)(*pauVar19 + lVar9 + 8) = 0;
                  lVar9 = lVar9 + 0x10;
                } while (uVar12 << 4 != lVar9);
              }
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != local_538);
      }
    }
    iVar7 = pnga_local_iterator_next
                      (&local_330,&local_528,(Integer *)local_4e8,&local_588,local_4a8);
  } while( true );
  lVar9 = lVar9 + 1;
  if (local_568 == lVar9) goto LAB_001274d4;
  goto LAB_001273f7;
}

Assistant:

static void gai_oper_elem(Integer g_a, Integer *lo, Integer *hi, void *scalar, Integer op)
{

  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  char *data_ptr;
  Integer me= pnga_nodeid();
  Integer num_blocks;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle(g_a, "gai_oper_elem");


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld)) {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    Integer nproc = pnga_nnodes();

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }
    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            data_ptr = (void*)((int*)data_ptr + offset);
            break;
          case C_DCPL:
            data_ptr = (void*)((double*)data_ptr + 2*offset);
            break;
          case C_SCPL:
            data_ptr = (void*)((float*)data_ptr + 2*offset);
            break;
          case C_DBL:
            data_ptr = (void*)((double*)data_ptr + offset);
            break;
          case C_FLOAT:
            data_ptr = (void*)((float*)data_ptr + offset);
            break;
          case C_LONG:
            data_ptr = (void*)((long*)data_ptr + offset);
            break;
          default: pnga_error(" wrong data type ",type);
        }
      }
      /* perform operation on all elements in local patch */
      ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);
    }
  }
#if 0
  if (num_blocks < 0) {
    /* get limits of VISIBLE patch */
    pnga_distribution(g_a, me, loA, hiA);

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* get data_ptr to corner of patch */
      /* ld are leading dimensions INCLUDING ghost cells */
      pnga_access_ptr(g_a, loA, hiA, &data_ptr, ld);

      /* perform operation on all elements in local patch */
      ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA);
    }
  } else {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    Integer nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {

        /* get limits of patch */
        pnga_distribution(g_a, i, loA, hiA); 

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",type);
            }
          }
          /* perform operation on all elements in local patch */
          ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* perform operation on all elements in local patch */
          ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}